

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_unique_int(REF_INT n,REF_INT *original,REF_INT *nunique,REF_INT *unique)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  *nunique = -1;
  ref_sort_insertion_int(n,original,unique);
  iVar1 = 1;
  if (1 < n) {
    uVar4 = 0;
    uVar2 = 1;
    do {
      uVar3 = (uint)(unique[uVar4] != unique[uVar2]) + (int)uVar4;
      uVar4 = (ulong)uVar3;
      if (uVar2 != uVar4) {
        unique[uVar4] = unique[uVar2];
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    iVar1 = uVar3 + 1;
  }
  *nunique = iVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_unique_int(REF_INT n, REF_INT *original,
                                       REF_INT *nunique, REF_INT *unique) {
  REF_INT i, j;

  *nunique = REF_EMPTY;

  RSS(ref_sort_insertion_int(n, original, unique), "sort in unique");

  j = 0;
  for (i = 1; i < n; i++) {
    if (unique[j] != unique[i]) j++;
    if (j != i) unique[j] = unique[i];
  }

  *nunique = j + 1;

  return REF_SUCCESS;
}